

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

StructElement * __thiscall
soul::PoolAllocator::
allocate<soul::heart::StructElement,soul::CodeLocation_const&,soul::heart::Expression&,std::__cxx11::string_const&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_75 [13];
  string local_68;
  CodeLocation local_48;
  StructElement *local_38;
  StructElement *newObject;
  PoolItem *newItem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  Expression *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (CodeLocation *)this;
  newObject = (StructElement *)allocateSpaceForObject(this,0x40);
  this_00 = &(newObject->super_Expression).super_Object.location.location;
  CodeLocation::CodeLocation(&local_48,(CodeLocation *)args_local_1);
  v = args_local_2;
  std::__cxx11::string::string((string *)&local_68,(string *)newItem);
  heart::StructElement::StructElement((StructElement *)this_00,&local_48,(Expression *)v,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  CodeLocation::~CodeLocation(&local_48);
  local_38 = (StructElement *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation_const&,soul::heart::Expression&,std::__cxx11::string_const&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_75);
  (newObject->super_Expression).super_Object.location.sourceCode.object = pSVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }